

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_join(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,
                           int toLocaleString)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint32_t c;
  ulong uVar4;
  JSValue v;
  JSValue v_00;
  JSValue JVar5;
  JSValue JVar6;
  int64_t local_78;
  JSValueUnion local_60;
  JSValueUnion local_58;
  StringBuffer local_50;
  
  local_58.float64 = 0.0;
  uVar1 = js_typed_array_get_length_internal(ctx,this_val);
  if ((int)uVar1 < 0) {
    JVar5 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    if ((argc < 1) || (toLocaleString != 0)) {
      c = 0x2c;
      JVar5 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else if ((int)argv->tag == 3) {
      c = 0x2c;
      JVar5 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      JVar5.tag = argv->tag;
      JVar5.u.ptr = (argv->u).ptr;
      JVar5 = JS_ToStringInternal(ctx,JVar5,0);
      local_58 = JVar5.u;
      if ((int)JVar5.tag == 6) {
LAB_0016fea3:
        return (JSValue)(ZEXT816(6) << 0x40);
      }
      if (*(int *)((long)local_58.ptr + 4) == 1) {
        c = (uint32_t)*(byte *)((long)local_58.ptr + 0x10);
      }
      else {
        c = 0xffffffff;
      }
    }
    local_78 = JVar5.tag;
    local_60 = JVar5.u;
    local_50.len = 0;
    local_50.size = 0;
    local_50.is_wide_char = 0;
    local_50.error_status = 0;
    local_50.ctx = ctx;
    local_50.str = js_alloc_string(ctx,0,0);
    if (local_50.str == (JSString *)0x0) {
      local_50._16_8_ = local_50._16_8_ & 0xffffffff;
      local_50.error_status = -1;
    }
    if (uVar1 != 0) {
      uVar4 = 1;
      if (1 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      uVar3 = 0;
      do {
        if (uVar3 != 0) {
          if ((int)c < 0) {
            iVar2 = string_buffer_concat
                              (&local_50,(JSString *)local_60.ptr,0,
                               *(uint *)((long)local_60.ptr + 4) & 0x7fffffff);
          }
          else {
            iVar2 = string_buffer_putc8(&local_50,c);
          }
          if (iVar2 == 0) goto LAB_0016ff88;
LAB_0017001e:
          (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
          local_50.str = (JSString *)0x0;
          if ((0xfffffff4 < (uint)JVar5.tag) &&
             (iVar2 = *local_58.ptr, *(int *)local_58.ptr = iVar2 + -1, iVar2 < 2)) {
            v_00.tag = local_78;
            v_00.u.ptr = local_58.ptr;
            __JS_FreeValueRT(ctx->rt,v_00);
          }
          goto LAB_0016fea3;
        }
LAB_0016ff88:
        JVar6.tag = 0;
        JVar6.u.ptr = (void *)uVar3;
        JVar6 = JS_GetPropertyValue(ctx,this_val,JVar6);
        if (1 < (int)JVar6.tag - 2U) {
          if ((int)JVar6.tag != 6) {
            if (toLocaleString != 0) {
              JVar6 = JS_ToLocaleStringFree(ctx,JVar6);
            }
            iVar2 = string_buffer_concat_value_free(&local_50,JVar6);
            if (iVar2 == 0) goto LAB_0016ffcc;
          }
          goto LAB_0017001e;
        }
LAB_0016ffcc:
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
    if ((0xfffffff4 < (uint)JVar5.tag) &&
       (iVar2 = *local_58.ptr, *(int *)local_58.ptr = iVar2 + -1, iVar2 < 2)) {
      v.tag = local_78;
      v.u.ptr = local_58.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
    JVar5 = string_buffer_end(&local_50);
  }
  return JVar5;
}

Assistant:

static JSValue js_typed_array_join(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv, int toLocaleString)
{
    JSValue sep = JS_UNDEFINED, el;
    StringBuffer b_s, *b = &b_s;
    JSString *p = NULL;
    int i, n;
    int c;

    n = js_typed_array_get_length_internal(ctx, this_val);
    if (n < 0)
        goto exception;

    c = ',';    /* default separator */
    if (!toLocaleString && argc > 0 && !JS_IsUndefined(argv[0])) {
        sep = JS_ToString(ctx, argv[0]);
        if (JS_IsException(sep))
            goto exception;
        p = JS_VALUE_GET_STRING(sep);
        if (p->len == 1 && !p->is_wide_char)
            c = p->u.str8[0];
        else
            c = -1;
    }
    string_buffer_init(ctx, b, 0);

    /* XXX: optimize with direct access */
    for(i = 0; i < n; i++) {
        if (i > 0) {
            if (c >= 0) {
                if (string_buffer_putc8(b, c))
                    goto fail;
            } else {
                if (string_buffer_concat(b, p, 0, p->len))
                    goto fail;
            }
        }
        el = JS_GetPropertyUint32(ctx, this_val, i);
        /* Can return undefined for example if the typed array is detached */
        if (!JS_IsNull(el) && !JS_IsUndefined(el)) {
            if (JS_IsException(el))
                goto fail;
            if (toLocaleString) {
                el = JS_ToLocaleStringFree(ctx, el);
            }
            if (string_buffer_concat_value_free(b, el))
                goto fail;
        }
    }
    JS_FreeValue(ctx, sep);
    return string_buffer_end(b);

fail:
    string_buffer_free(b);
    JS_FreeValue(ctx, sep);
exception:
    return JS_EXCEPTION;
}